

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int convertCompoundSelectToSubquery(Walker *pWalker,Select *p)

{
  sqlite3 *db_00;
  undefined8 pParse_00;
  Select *pSubquery;
  SrcList *pSVar1;
  Expr *pExpr;
  ExprList *pEVar2;
  bool bVar3;
  undefined1 local_68 [8];
  Token dummy;
  Parse *pParse;
  SrcList *pNewSrc;
  ExprList_item *a;
  sqlite3 *db;
  Select *pX;
  Select *pNew;
  int i;
  Select *p_local;
  Walker *pWalker_local;
  
  if (p->pPrior == (Select *)0x0) {
    pWalker_local._4_4_ = 0;
  }
  else {
    db = (sqlite3 *)p;
    if (p->pOrderBy == (ExprList *)0x0) {
      pWalker_local._4_4_ = 0;
    }
    else {
      while( true ) {
        bVar3 = false;
        if ((db != (sqlite3 *)0x0) && (bVar3 = true, *(char *)&db->pVdbe != -0x80)) {
          bVar3 = *(char *)&db->pVdbe == -0x7d;
        }
        if (!bVar3) break;
        db = *(sqlite3 **)&db->errCode;
      }
      if (db == (sqlite3 *)0x0) {
        pWalker_local._4_4_ = 0;
      }
      else {
        pNew._4_4_ = p->pOrderBy->nExpr;
        do {
          pNew._4_4_ = pNew._4_4_ + -1;
          if (pNew._4_4_ < 0) break;
        } while (((p->pOrderBy->a[pNew._4_4_].pExpr)->flags & 0x100) == 0);
        if (pNew._4_4_ < 0) {
          pWalker_local._4_4_ = 0;
        }
        else {
          dummy._8_8_ = pWalker->pParse;
          db_00 = ((Parse *)dummy._8_8_)->db;
          pSubquery = (Select *)sqlite3DbMallocZero(db_00,0x80);
          if (pSubquery == (Select *)0x0) {
            pWalker_local._4_4_ = 2;
          }
          else {
            memset(local_68,0,0x10);
            pSVar1 = sqlite3SrcListAppendFromTerm
                               ((Parse *)dummy._8_8_,(SrcList *)0x0,(Token *)0x0,(Token *)0x0,
                                (Token *)local_68,pSubquery,(Expr *)0x0,(IdList *)0x0);
            if (pSVar1 == (SrcList *)0x0) {
              pWalker_local._4_4_ = 2;
            }
            else {
              memcpy(pSubquery,p,0x80);
              pParse_00 = dummy._8_8_;
              p->pSrc = pSVar1;
              pExpr = sqlite3Expr(db_00,0xac,(char *)0x0);
              pEVar2 = sqlite3ExprListAppend((Parse *)pParse_00,(ExprList *)0x0,pExpr);
              p->pEList = pEVar2;
              p->op = 0x83;
              p->pWhere = (Expr *)0x0;
              pSubquery->pGroupBy = (ExprList *)0x0;
              pSubquery->pHaving = (Expr *)0x0;
              pSubquery->pOrderBy = (ExprList *)0x0;
              p->pPrior = (Select *)0x0;
              p->pNext = (Select *)0x0;
              p->pWith = (With *)0x0;
              p->selFlags = p->selFlags & 0xfffffeff;
              p->selFlags = p->selFlags | 0x10000;
              pSubquery->pPrior->pNext = pSubquery;
              pSubquery->pLimit = (Expr *)0x0;
              pWalker_local._4_4_ = 0;
            }
          }
        }
      }
    }
  }
  return pWalker_local._4_4_;
}

Assistant:

static int convertCompoundSelectToSubquery(Walker *pWalker, Select *p){
  int i;
  Select *pNew;
  Select *pX;
  sqlite3 *db;
  struct ExprList_item *a;
  SrcList *pNewSrc;
  Parse *pParse;
  Token dummy;

  if( p->pPrior==0 ) return WRC_Continue;
  if( p->pOrderBy==0 ) return WRC_Continue;
  for(pX=p; pX && (pX->op==TK_ALL || pX->op==TK_SELECT); pX=pX->pPrior){}
  if( pX==0 ) return WRC_Continue;
  a = p->pOrderBy->a;
  for(i=p->pOrderBy->nExpr-1; i>=0; i--){
    if( a[i].pExpr->flags & EP_Collate ) break;
  }
  if( i<0 ) return WRC_Continue;

  /* If we reach this point, that means the transformation is required. */

  pParse = pWalker->pParse;
  db = pParse->db;
  pNew = sqlite3DbMallocZero(db, sizeof(*pNew) );
  if( pNew==0 ) return WRC_Abort;
  memset(&dummy, 0, sizeof(dummy));
  pNewSrc = sqlite3SrcListAppendFromTerm(pParse,0,0,0,&dummy,pNew,0,0);
  if( pNewSrc==0 ) return WRC_Abort;
  *pNew = *p;
  p->pSrc = pNewSrc;
  p->pEList = sqlite3ExprListAppend(pParse, 0, sqlite3Expr(db, TK_ASTERISK, 0));
  p->op = TK_SELECT;
  p->pWhere = 0;
  pNew->pGroupBy = 0;
  pNew->pHaving = 0;
  pNew->pOrderBy = 0;
  p->pPrior = 0;
  p->pNext = 0;
  p->pWith = 0;
  p->selFlags &= ~SF_Compound;
  assert( (p->selFlags & SF_Converted)==0 );
  p->selFlags |= SF_Converted;
  assert( pNew->pPrior!=0 );
  pNew->pPrior->pNext = pNew;
  pNew->pLimit = 0;
  return WRC_Continue;
}